

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Quat4f.cpp
# Opt level: O1

Quat4f __thiscall
Quat4f::cubicInterpolate(Quat4f *this,Quat4f *q0,Quat4f *q1,Quat4f *q2,Quat4f *q3,float t)

{
  Quat4f QVar1;
  Quat4f q1q2_q2q3;
  Quat4f q0q1_q1q2;
  Quat4f q2q3;
  Quat4f q1q2;
  Quat4f q0q1;
  Quat4f local_80;
  Quat4f local_70;
  Quat4f local_60;
  Quat4f local_50;
  Quat4f local_40;
  
  slerp(&local_40,q0,t + 1.0,SUB81(q1,0));
  slerp(&local_50,q1,t,SUB81(q2,0));
  slerp(&local_60,q2,t + -1.0,SUB81(q3,0));
  slerp(&local_70,&local_40,(t + 1.0) * 0.5,SUB81(&local_50,0));
  slerp(&local_80,&local_50,t * 0.5,SUB81(&local_60,0));
  QVar1 = slerp(this,&local_70,t,SUB81(&local_80,0));
  return (Quat4f)QVar1.m_elements;
}

Assistant:

Quat4f Quat4f::cubicInterpolate( const Quat4f& q0, const Quat4f& q1, const Quat4f& q2, const Quat4f& q3, float t )
{
	// geometric construction:
	//            t
	//   (t+1)/2     t/2
	// t+1        t	        t-1

	// bottom level
	Quat4f q0q1 = Quat4f::slerp( q0, q1, t + 1 );
	Quat4f q1q2 = Quat4f::slerp( q1, q2, t );
	Quat4f q2q3 = Quat4f::slerp( q2, q3, t - 1 );

	// middle level
	Quat4f q0q1_q1q2 = Quat4f::slerp( q0q1, q1q2, 0.5f * ( t + 1 ) );
	Quat4f q1q2_q2q3 = Quat4f::slerp( q1q2, q2q3, 0.5f * t );

	// top level
	return Quat4f::slerp( q0q1_q1q2, q1q2_q2q3, t );
}